

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

CommPtr __thiscall Omega_h::Comm::graph_inverse(Comm *this)

{
  int *piVar1;
  Alloc *pAVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Read<int> *in_RSI;
  CommPtr CVar4;
  Read<int> local_30;
  Alloc *local_20;
  Alloc *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_30.write_.shared_alloc_.alloc = (Alloc *)in_RSI[1].write_.shared_alloc_.direct_ptr;
  if (((ulong)local_30.write_.shared_alloc_.alloc & 7) == 0 &&
      local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_30.write_.shared_alloc_.alloc =
           (Alloc *)((local_30.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_30.write_.shared_alloc_.alloc)->use_count =
           (local_30.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_30.write_.shared_alloc_.direct_ptr = in_RSI[2].write_.shared_alloc_.alloc;
  local_20 = (Alloc *)(in_RSI->write_).shared_alloc_.direct_ptr;
  if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_20 = (Alloc *)(local_20->size * 8 + 1);
    }
    else {
      local_20->use_count = local_20->use_count + 1;
    }
  }
  local_18 = in_RSI[1].write_.shared_alloc_.alloc;
  CVar4 = graph_adjacent(this,in_RSI,&local_30);
  pAVar2 = local_20;
  _Var3 = CVar4.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
    piVar1 = &local_20->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_20);
      operator_delete(pAVar2,0x48);
      _Var3._M_pi = extraout_RDX;
    }
  }
  pAVar2 = local_30.write_.shared_alloc_.alloc;
  if (((ulong)local_30.write_.shared_alloc_.alloc & 7) == 0 &&
      local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_30.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  CVar4.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar4.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (CommPtr)CVar4.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CommPtr Comm::graph_inverse() const {
  return graph_adjacent(destinations(), sources());
}